

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

void Bfree(Bigint *v)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  mchunkptr pmVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  malloc_tree_chunk **ppmVar8;
  malloc_tree_chunk *pmVar9;
  mstate pmVar10;
  byte bVar11;
  uint uVar12;
  mstate pmVar13;
  mstate pmVar14;
  uint uVar15;
  malloc_tree_chunk *pmVar16;
  char *pcVar17;
  mstate pmVar18;
  ulong uVar19;
  int iStack_24;
  
  iVar6 = _gm_.mutex;
  if (v == (Bigint *)0x0) {
    return;
  }
  iVar1 = v->k;
  lVar7 = (long)iVar1;
  if (lVar7 < 8) {
    v->next = TI0.Freelist[lVar7];
    TI0.Freelist[lVar7] = v;
    return;
  }
  if (v == (Bigint *)0x0) {
    return;
  }
  pmVar14 = (mstate)&v[-1].sign;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar15 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar6 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar15 & 0x3f) == 0) {
          sched_yield();
        }
        uVar15 = uVar15 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  if ((pmVar14 < _gm_.least_addr) || (uVar2 = *(ulong *)v[-1].x, ((uint)uVar2 & 3) == 1))
  goto LAB_00109dca;
  uVar19 = uVar2 & 0xfffffffffffffff8;
  pmVar13 = (mstate)((long)pmVar14 + uVar19);
  if ((uVar2 & 1) == 0) {
    uVar3 = *(ulong *)pmVar14;
    if ((uVar2 & 2) == 0) {
      uVar19 = uVar19 + uVar3 + 0x20;
      iVar6 = munmap((void *)((long)pmVar14 - uVar3),uVar19);
      iStack_24 = 2;
      if (iVar6 == 0) {
        _gm_.footprint = _gm_.footprint - uVar19;
      }
    }
    else {
      pmVar14 = (mstate)((long)pmVar14 - uVar3);
      uVar19 = uVar19 + uVar3;
      if (_gm_.least_addr <= pmVar14) {
        if (pmVar14 == (mstate)_gm_.dv) {
          if ((~(uint)pmVar13->dvsize & 3) == 0) {
            _gm_.dvsize = uVar19;
            pmVar13->dvsize = pmVar13->dvsize & 0xfffffffffffffffe;
            pmVar14->dvsize = uVar19 | 1;
            *(ulong *)pmVar13 = uVar19;
            iStack_24 = 2;
            goto LAB_00109819;
          }
        }
        else {
          if (0xff < uVar3) {
            pmVar10 = (mstate)pmVar14->least_addr;
            pmVar9 = (malloc_tree_chunk *)pmVar14->trim_check;
            if (pmVar10 == pmVar14) {
              pmVar10 = (mstate)pmVar14->top;
              if (pmVar10 != (mstate)0x0) {
                ppmVar8 = (malloc_tree_chunk **)&pmVar14->top;
LAB_00109884:
                do {
                  if (pmVar10->top == (mchunkptr)0x0) {
                    if ((malloc_tree_chunk *)pmVar10->dv == (malloc_tree_chunk *)0x0)
                    goto code_r0x00109898;
                    ppmVar8 = (malloc_tree_chunk **)&pmVar10->dv;
                  }
                  else {
                    ppmVar8 = (malloc_tree_chunk **)&pmVar10->top;
                  }
                  pmVar10 = (mstate)*ppmVar8;
                } while( true );
              }
              pmVar10 = (mstate)pmVar14->dv;
              if (pmVar10 != (mstate)0x0) {
                ppmVar8 = (malloc_tree_chunk **)&pmVar14->dv;
                goto LAB_00109884;
              }
              pmVar10 = (mstate)0x0;
            }
            else {
              pmVar16 = (malloc_tree_chunk *)pmVar14->topsize;
              if (((pmVar16 < _gm_.least_addr) || ((mstate)pmVar16->bk != pmVar14)) ||
                 ((mstate)pmVar10->topsize != pmVar14)) goto LAB_00109dca;
              pmVar16->bk = (malloc_tree_chunk *)pmVar10;
              pmVar10->topsize = (size_t)pmVar16;
            }
            goto LAB_001098a8;
          }
          pmVar9 = (malloc_tree_chunk *)pmVar14->topsize;
          pmVar16 = (malloc_tree_chunk *)pmVar14->least_addr;
          if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar3 >> 3) * 2)) &&
             ((pmVar9 < _gm_.least_addr || ((mstate)pmVar9->bk != pmVar14)))) goto LAB_00109dca;
          if (pmVar16 == pmVar9) {
            free_cold_1();
          }
          else {
            if ((pmVar16 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar3 >> 3) * 2)) &&
               ((pmVar16 < _gm_.least_addr || ((mstate)pmVar16->fd != pmVar14)))) goto LAB_00109dca;
            pmVar9->bk = pmVar16;
            pmVar16->fd = pmVar9;
          }
        }
        bVar5 = true;
        iStack_24 = 0;
        goto LAB_0010995a;
      }
      iStack_24 = 5;
    }
LAB_00109819:
    bVar5 = false;
    goto LAB_0010995a;
  }
LAB_00109962:
  iStack_24 = 0;
  if ((pmVar14 < pmVar13) && (uVar2 = pmVar13->dvsize, (uVar2 & 1) != 0)) {
    if ((uVar2 & 2) != 0) {
      pmVar13->dvsize = uVar2 & 0xfffffffffffffffe;
      pmVar14->dvsize = uVar19 | 1;
      *(ulong *)((long)pmVar14->smallbins + (uVar19 - 0x48)) = uVar19;
      goto LAB_00109bb7;
    }
    if (pmVar13 == (mstate)_gm_.top) {
      free_cold_2();
      iStack_24 = iVar1 >> 0x1f;
      goto LAB_00109d71;
    }
    if (pmVar13 != (mstate)_gm_.dv) {
      if (0xff < uVar2) {
        pmVar10 = (mstate)pmVar13->least_addr;
        pmVar9 = (malloc_tree_chunk *)pmVar13->trim_check;
        if (pmVar10 == pmVar13) {
          pmVar10 = (mstate)pmVar13->top;
          if (pmVar10 != (mstate)0x0) {
            ppmVar8 = (malloc_tree_chunk **)&pmVar13->top;
LAB_00109ab2:
            do {
              if (pmVar10->top == (mchunkptr)0x0) {
                if ((malloc_tree_chunk *)pmVar10->dv == (malloc_tree_chunk *)0x0)
                goto code_r0x00109ac6;
                ppmVar8 = (malloc_tree_chunk **)&pmVar10->dv;
              }
              else {
                ppmVar8 = (malloc_tree_chunk **)&pmVar10->top;
              }
              pmVar10 = (mstate)*ppmVar8;
            } while( true );
          }
          pmVar10 = (mstate)pmVar13->dv;
          if (pmVar10 != (mstate)0x0) {
            ppmVar8 = (malloc_tree_chunk **)&pmVar13->dv;
            goto LAB_00109ab2;
          }
          pmVar10 = (mstate)0x0;
        }
        else {
          pmVar16 = (malloc_tree_chunk *)pmVar13->topsize;
          if (((pmVar16 < _gm_.least_addr) || ((mstate)pmVar16->bk != pmVar13)) ||
             ((mstate)pmVar10->topsize != pmVar13)) goto LAB_00109dca;
          pmVar16->bk = (malloc_tree_chunk *)pmVar10;
          pmVar10->topsize = (size_t)pmVar16;
        }
        goto LAB_00109ada;
      }
      pmVar9 = (malloc_tree_chunk *)pmVar13->topsize;
      pmVar16 = (malloc_tree_chunk *)pmVar13->least_addr;
      if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
         ((pmVar9 < _gm_.least_addr || ((mstate)pmVar9->bk != pmVar13)))) goto LAB_00109dca;
      if (pmVar16 == pmVar9) {
        bVar11 = (byte)(uVar2 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar16 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
           ((pmVar16 < _gm_.least_addr || ((mstate)pmVar16->fd != pmVar13)))) goto LAB_00109dca;
        pmVar9->bk = pmVar16;
        pmVar16->fd = pmVar9;
      }
      goto LAB_00109b7e;
    }
    free_cold_3();
LAB_00109c50:
    iStack_24 = 2;
  }
LAB_00109d71:
  if (iStack_24 == 2) {
    if (((byte)_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    return;
  }
LAB_00109dca:
  abort();
code_r0x00109898:
  if (ppmVar8 < _gm_.least_addr) goto LAB_00109dca;
  *ppmVar8 = (malloc_tree_chunk *)0x0;
LAB_001098a8:
  iVar6 = 0;
  bVar5 = true;
  iStack_24 = 0;
  if (pmVar9 != (malloc_tree_chunk *)0x0) {
    uVar15 = (uint)pmVar14->release_checks;
    iStack_24 = iVar6;
    if (pmVar14 == (mstate)_gm_.treebins[uVar15]) {
      _gm_.treebins[uVar15] = (tbinptr)pmVar10;
      if (pmVar10 == (mstate)0x0) {
        bVar11 = (byte)uVar15 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        goto LAB_00109902;
      }
    }
    else {
      if (pmVar9 < _gm_.least_addr) goto LAB_00109dca;
      if ((mstate)pmVar9->child[0] == pmVar14) {
        pmVar9->child[0] = (malloc_tree_chunk *)pmVar10;
      }
      else {
        pmVar9->child[1] = (malloc_tree_chunk *)pmVar10;
      }
LAB_00109902:
      if (pmVar10 == (mstate)0x0) goto LAB_0010995a;
    }
    pcVar17 = _gm_.least_addr;
    if (pmVar10 < _gm_.least_addr) goto LAB_00109dca;
    pmVar10->trim_check = (size_t)pmVar9;
    pmVar9 = (malloc_tree_chunk *)pmVar14->dv;
    if (pmVar9 != (malloc_tree_chunk *)0x0) {
      if (pmVar9 < pcVar17) goto LAB_00109dca;
      pmVar10->dv = (mchunkptr)pmVar9;
      pmVar9->parent = (malloc_tree_chunk *)pmVar10;
    }
    pmVar4 = pmVar14->top;
    if (pmVar4 != (mchunkptr)0x0) {
      if (pmVar4 < pcVar17) goto LAB_00109dca;
      pmVar10->top = pmVar4;
      pmVar4[1].fd = (malloc_chunk *)pmVar10;
    }
  }
LAB_0010995a:
  if (bVar5) goto LAB_00109962;
  goto LAB_00109d71;
code_r0x00109ac6:
  if (ppmVar8 < _gm_.least_addr) goto LAB_00109dca;
  *ppmVar8 = (malloc_tree_chunk *)0x0;
LAB_00109ada:
  if (pmVar9 != (malloc_tree_chunk *)0x0) {
    uVar15 = (uint)pmVar13->release_checks;
    if (pmVar13 == (mstate)_gm_.treebins[uVar15]) {
      _gm_.treebins[uVar15] = (tbinptr)pmVar10;
      if (pmVar10 == (mstate)0x0) {
        bVar11 = (byte)uVar15 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        goto LAB_00109b31;
      }
    }
    else {
      if (pmVar9 < _gm_.least_addr) goto LAB_00109dca;
      if ((mstate)pmVar9->child[0] == pmVar13) {
        pmVar9->child[0] = (malloc_tree_chunk *)pmVar10;
      }
      else {
        pmVar9->child[1] = (malloc_tree_chunk *)pmVar10;
      }
LAB_00109b31:
      if (pmVar10 == (mstate)0x0) goto LAB_00109b7e;
    }
    pcVar17 = _gm_.least_addr;
    if (pmVar10 < _gm_.least_addr) goto LAB_00109dca;
    pmVar10->trim_check = (size_t)pmVar9;
    pmVar9 = (malloc_tree_chunk *)pmVar13->dv;
    if (pmVar9 != (malloc_tree_chunk *)0x0) {
      if (pmVar9 < pcVar17) goto LAB_00109dca;
      pmVar10->dv = (mchunkptr)pmVar9;
      pmVar9->parent = (malloc_tree_chunk *)pmVar10;
    }
    pmVar4 = pmVar13->top;
    if (pmVar4 != (mchunkptr)0x0) {
      if (pmVar4 < pcVar17) goto LAB_00109dca;
      pmVar10->top = pmVar4;
      pmVar4[1].fd = (malloc_chunk *)pmVar10;
    }
  }
LAB_00109b7e:
  uVar19 = (uVar2 & 0xfffffffffffffff8) + uVar19;
  pmVar14->dvsize = uVar19 | 1;
  *(ulong *)((long)pmVar14->smallbins + (uVar19 - 0x48)) = uVar19;
  if (pmVar14 == (mstate)_gm_.dv) {
    iStack_24 = 2;
    _gm_.dvsize = uVar19;
  }
  else {
LAB_00109bb7:
    if (uVar19 < 0x100) {
      uVar19 = uVar19 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar19 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar19 & 0x1f);
        pmVar9 = (malloc_tree_chunk *)(_gm_.smallbins + uVar19 * 2);
      }
      else {
        pmVar9 = (malloc_tree_chunk *)_gm_.smallbins[uVar19 * 2 + 2];
        if ((malloc_tree_chunk *)_gm_.smallbins[uVar19 * 2 + 2] < _gm_.least_addr)
        goto LAB_00109dca;
      }
      _gm_.smallbins[uVar19 * 2 + 2] = (mchunkptr)pmVar14;
      pmVar9->bk = (malloc_tree_chunk *)pmVar14;
      pmVar14->topsize = (size_t)pmVar9;
      pmVar14->least_addr = (char *)(_gm_.smallbins + uVar19 * 2);
      goto LAB_00109c50;
    }
    uVar15 = (uint)(uVar19 >> 8);
    if (uVar15 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar15 < 0x10000) {
        uVar12 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uint)((uVar19 >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar12 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar9 = (malloc_tree_chunk *)(_gm_.treebins + uVar12);
    *(uint *)&pmVar14->release_checks = uVar12;
    pmVar14->dv = (mchunkptr)0x0;
    pmVar14->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      lVar7 = 0x10;
      pmVar18 = (mstate)&DAT_00000030;
      pmVar13 = pmVar14;
      pmVar16 = pmVar9;
      pmVar10 = pmVar14;
LAB_00109d4f:
      pmVar16->prev_foot = (size_t)pmVar14;
      *(malloc_tree_chunk **)
       ((long)(((malloc_state *)(((malloc_state *)(pmVar18->smallbins + -9))->smallbins + -9))->
               smallbins + 0xfffffffffffffff7) +
       (long)((malloc_state *)
             (((malloc_state *)(((malloc_state *)(pmVar14->smallbins + -9))->smallbins + -9))->
              smallbins + -9))->smallbins + 0xffffffffffffffb8U) = pmVar9;
      pmVar14->least_addr = (char *)pmVar13;
      *(mstate *)((long)pmVar14->smallbins + lVar7 + -0x48) = pmVar10;
      pmVar13 = pmVar18;
    }
    else {
      pmVar13 = (mstate)pmVar9->prev_foot;
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar7 = uVar19 << (bVar11 & 0x3f);
      do {
        if ((pmVar13->dvsize & 0xfffffffffffffff8) == uVar19) {
          if ((pmVar13 < _gm_.least_addr) ||
             (pmVar9 = (malloc_tree_chunk *)pmVar13->topsize, pmVar9 < _gm_.least_addr))
          goto LAB_00109dca;
          pmVar9->bk = (malloc_tree_chunk *)pmVar14;
          lVar7 = 0x30;
          pmVar18 = (mstate)&DAT_00000010;
          pmVar16 = (malloc_tree_chunk *)&pmVar13->topsize;
          pmVar10 = (mstate)0x0;
          goto LAB_00109d4f;
        }
        pmVar10 = *(mstate *)((long)pmVar13 + (lVar7 >> 0x3f) * -8 + 0x20);
        pmVar18 = pmVar10;
        if (pmVar10 == (mstate)0x0) {
          pcVar17 = (char *)((long)pmVar13 + (lVar7 >> 0x3f) * -8 + 0x20);
          if (pcVar17 < _gm_.least_addr) goto LAB_00109dca;
          *(mstate *)pcVar17 = pmVar14;
          pmVar14->trim_check = (size_t)pmVar13;
          pmVar14->least_addr = (char *)pmVar14;
          pmVar14->topsize = (size_t)pmVar14;
          pmVar18 = pmVar13;
        }
        pmVar13 = pmVar18;
        lVar7 = lVar7 * 2;
      } while (pmVar10 != (mstate)0x0);
    }
    _gm_.release_checks = _gm_.release_checks - 1;
    iStack_24 = 2;
    if (_gm_.release_checks == 0) {
      release_unused_segments(pmVar13);
    }
  }
  goto LAB_00109d71;
}

Assistant:

static void
Bfree(Bigint *v MTd)
{
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	if (v) {
		if (v->k > Kmax)
			FREE((void*)v);
		else {
#ifdef MULTIPLE_THREADS
			if (!(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(0);
#endif
			v->next = freelist[v->k];
			freelist[v->k] = v;
#ifdef MULTIPLE_THREADS
			if (TI == &TI0)
				FREE_DTOA_LOCK(0);
#endif
			}
		}
	}